

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabbar.cpp
# Opt level: O3

void __thiscall QTabBar::setTabVisible(QTabBar *this,int index,bool visible)

{
  QTabBarPrivate *this_00;
  Tab *pTVar1;
  QWidget *pQVar2;
  byte bVar3;
  int index_00;
  
  this_00 = *(QTabBarPrivate **)&(this->super_QWidget).field_0x8;
  if ((((ulong)(long)index < (ulong)(this_00->tabList).d.size) &&
      (pTVar1 = (this_00->tabList).d.ptr[index], pTVar1 != (Tab *)0x0)) &&
     (bVar3 = (pTVar1->field_0xe4 & 2) >> 1 ^ visible,
     *(ushort *)&this_00->field_0x2d0 =
          (ushort)*(undefined4 *)&this_00->field_0x2d0 & 0xfffe | (ushort)bVar3, bVar3 == 1)) {
    pTVar1->field_0xe4 = pTVar1->field_0xe4 & 0xfd | visible * '\x02';
    pQVar2 = pTVar1->leftWidget;
    if (pQVar2 != (QWidget *)0x0) {
      (**(code **)(*(long *)pQVar2 + 0x68))(pQVar2,visible);
    }
    pQVar2 = pTVar1->rightWidget;
    if (pQVar2 != (QWidget *)0x0) {
      (**(code **)(*(long *)pQVar2 + 0x68))(pQVar2,visible);
    }
    QWidget::setShortcutEnabled(&this->super_QWidget,pTVar1->shortcutId,visible);
    QTabBarPrivate::calculateFirstLastVisible(this_00,index,visible,false);
    if ((!visible) && (this_00->currentIndex == index)) {
      index_00 = QTabBarPrivate::selectNewCurrentIndexFrom(this_00,index + 1);
      setCurrentIndex(this,index_00);
    }
    QWidget::update(&this->super_QWidget);
    return;
  }
  return;
}

Assistant:

void QTabBar::setTabVisible(int index, bool visible)
{
    Q_D(QTabBar);
    if (QTabBarPrivate::Tab *tab = d->at(index)) {
        d->layoutDirty = (visible != tab->visible);
        if (!d->layoutDirty)
            return;
        tab->visible = visible;
        if (tab->leftWidget)
            tab->leftWidget->setVisible(visible);
        if (tab->rightWidget)
            tab->rightWidget->setVisible(visible);
#ifndef QT_NO_SHORTCUT
        setShortcutEnabled(tab->shortcutId, visible);
#endif
        d->calculateFirstLastVisible(index, visible, false);
        if (!visible && index == d->currentIndex) {
            const int newindex = d->selectNewCurrentIndexFrom(index+1);
            setCurrentIndex(newindex);
        }
        update();
    }
}